

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O0

void __thiscall RM_FileScan::~RM_FileScan(RM_FileScan *this)

{
  RM_FileScan *this_local;
  
  if ((((this->scanEnded & 1U) == 0) && ((this->hasPagePinned & 1U) == 1)) &&
     ((this->openScan & 1U) == 1)) {
    PF_FileHandle::UnpinPage(&this->fileHandle->pfh,this->scanPage);
  }
  if ((this->initializedValue & 1U) == 1) {
    free(this->value);
    this->initializedValue = false;
  }
  PF_PageHandle::~PF_PageHandle(&this->currentPH);
  return;
}

Assistant:

RM_FileScan::~RM_FileScan(){
  if(scanEnded == false && hasPagePinned == true && openScan == true){
    fileHandle->pfh.UnpinPage(scanPage);
  }
  if (initializedValue == true){ // free any memory not freed
    free(value);
    initializedValue = false;
  }
}